

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O0

SPxId __thiscall soplex::SPxDantzigPR<double>::selectEnterX(SPxDantzigPR<double> *this)

{
  double dVar1;
  bool bVar2;
  SPxId *enterId_00;
  long in_RDI;
  double bestCo;
  double best;
  SPxId enterIdCo;
  SPxId enterId;
  DataKey local_40;
  DataKey local_38;
  DataKey in_stack_ffffffffffffffe0;
  DataKey in_stack_ffffffffffffffe8;
  DataKey local_8;
  
  SPxId::SPxId((SPxId *)0x2e87ec);
  SPxId::SPxId((SPxId *)0x2e87f6);
  enterId_00 = (SPxId *)(*(ulong *)(in_RDI + 0x18) ^ 0x8000000000000000);
  dVar1 = *(double *)(in_RDI + 0x18);
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x899) & 1) == 0) {
    local_38 = (DataKey)selectEnterDenseDim((SPxDantzigPR<double> *)in_stack_ffffffffffffffe8,
                                            (double *)in_stack_ffffffffffffffe0,enterId_00);
  }
  else {
    local_38 = (DataKey)selectEnterSparseDim
                                  ((SPxDantzigPR<double> *)in_stack_ffffffffffffffe8,
                                   (double *)in_stack_ffffffffffffffe0,enterId_00);
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89a) & 1) == 0) {
    local_40 = (DataKey)selectEnterDenseCoDim
                                  ((SPxDantzigPR<double> *)local_38,
                                   (double *)in_stack_ffffffffffffffe0,enterId_00);
  }
  else {
    local_40 = (DataKey)selectEnterSparseCoDim
                                  ((SPxDantzigPR<double> *)local_38,
                                   (double *)in_stack_ffffffffffffffe0,enterId_00);
  }
  bVar2 = SPxId::isValid((SPxId *)&stack0xffffffffffffffe8);
  if ((!bVar2) ||
     ((local_8 = local_38, (double)enterId_00 <= -dVar1 * 0.8 &&
      (bVar2 = SPxId::isValid((SPxId *)&stack0xffffffffffffffe0), local_8 = local_38, bVar2)))) {
    local_8 = local_40;
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}